

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkInterface
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget)

{
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  reference __x;
  cmLinkImplementation *this_00;
  reference __x_00;
  cmLinkImplementationLibraries *pcVar4;
  ulong uVar5;
  char *pcVar6;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar7;
  allocator<char> local_191;
  string local_190;
  char *local_170;
  char *reps;
  char *config_reps;
  undefined1 local_158 [8];
  string propName;
  allocator<char> local_111;
  string local_110 [8];
  string suffix;
  cmLinkImplementation *impl_2;
  cmLinkImplementationLibraries *impl_1;
  cmLinkImplItem *lib_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range4;
  cmLinkImplementation *impl;
  cmLinkItem *lib;
  iterator __end3;
  iterator __begin3;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  cmGeneratorTarget *headTarget_local;
  cmOptionalLinkInterface *iface_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)headTarget;
  if (iface->ExplicitLibraries == (char *)0x0) {
    PVar3 = GetPolicyStatusCMP0022(this);
    if ((PVar3 == WARN) || (PVar3 = GetPolicyStatusCMP0022(this), PVar3 == OLD)) {
      pcVar4 = GetLinkImplementationLibrariesInternal
                         (this,config,
                          (cmGeneratorTarget *)
                          emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
      (iface->super_cmLinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_cmLinkInterface).WrongConfigLibraries,&pcVar4->WrongConfigLibraries)
      ;
    }
  }
  else {
    TVar2 = GetType(this);
    if (((TVar2 == SHARED_LIBRARY) || (TVar2 = GetType(this), TVar2 == STATIC_LIBRARY)) ||
       (TVar2 = GetType(this), TVar2 == INTERFACE_LIBRARY)) {
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set
                ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)&__range3);
      __end3 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                         ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      lib = (cmLinkItem *)
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                         *)&lib), bVar1) {
        __x = __gnu_cxx::
              __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
              ::operator*(&__end3);
        std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                  ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)&__range3,
                   __x);
        __gnu_cxx::
        __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
        operator++(&__end3);
      }
      TVar2 = GetType(this);
      if (TVar2 != INTERFACE_LIBRARY) {
        this_00 = GetLinkImplementation(this,config);
        __end4 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                           ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00);
        lib_1 = (cmLinkImplItem *)
                std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                          ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                           *)&lib_1), bVar1) {
          __x_00 = __gnu_cxx::
                   __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                   ::operator*(&__end4);
          pVar7 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                            ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                             &__range3,&__x_00->super_cmLinkItem);
          if (((((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
              ((__x_00->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0)) &&
             (TVar2 = GetType((__x_00->super_cmLinkItem).Target), TVar2 == SHARED_LIBRARY)) {
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                      (&(iface->super_cmLinkInterface).SharedDeps,&__x_00->super_cmLinkItem);
          }
          __gnu_cxx::
          __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
          ::operator++(&__end4);
        }
      }
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::~set
                ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)&__range3);
    }
  }
  bVar1 = LinkLanguagePropagatesToDependents(this);
  if ((bVar1) &&
     (suffix.field_2._8_8_ = GetLinkImplementation(this,config),
     (cmLinkImplementation *)suffix.field_2._8_8_ != (cmLinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_cmLinkInterface).Languages,
                &((cmLinkImplementation *)suffix.field_2._8_8_)->Languages);
  }
  TVar2 = GetType(this);
  if (TVar2 == STATIC_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_110,"_",&local_111);
    std::allocator<char>::~allocator(&local_111);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cmsys::SystemTools::UpperCase((string *)((long)&propName.field_2 + 8),config);
      std::__cxx11::string::operator+=(local_110,(string *)(propName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(propName.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::operator+=(local_110,"NOCONFIG");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_158,"LINK_INTERFACE_MULTIPLICITY",
               (allocator<char> *)((long)&config_reps + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&config_reps + 7));
    std::__cxx11::string::operator+=((string *)local_158,local_110);
    reps = GetProperty(this,(string *)local_158);
    if (reps == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"LINK_INTERFACE_MULTIPLICITY",&local_191);
      pcVar6 = GetProperty(this,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      local_170 = pcVar6;
      if (pcVar6 != (char *)0x0) {
        __isoc99_sscanf(pcVar6,"%u",&(iface->super_cmLinkInterface).Multiplicity);
      }
    }
    else {
      __isoc99_sscanf(reps,"%u",&(iface->super_cmLinkInterface).Multiplicity);
    }
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string(local_110);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterface(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget) const
{
  if (iface.ExplicitLibraries) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      std::set<cmLinkItem> emitted;
      for (cmLinkItem const& lib : iface.Libraries) {
        emitted.insert(lib);
      }
      if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
        cmLinkImplementation const* impl = this->GetLinkImplementation(config);
        for (cmLinkImplItem const& lib : impl->Libraries) {
          if (emitted.insert(lib).second) {
            if (lib.Target) {
              // This is a runtime dependency on another shared library.
              if (lib.Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
                iface.SharedDeps.push_back(lib);
              }
            } else {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that creates
              // a chicken-and-egg problem since this list is needed for its
              // construction.
            }
          }
        }
      }
    }
  } else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN ||
             this->GetPolicyStatusCMP0022() == cmPolicies::OLD) {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
  }

  if (this->LinkLanguagePropagatesToDependents()) {
    // Targets using this archive need its language runtime libraries.
    if (cmLinkImplementation const* impl =
          this->GetLinkImplementation(config)) {
      iface.Languages = impl->Languages;
    }
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if (!config.empty()) {
      suffix += cmSystemTools::UpperCase(config);
    } else {
      suffix += "NOCONFIG";
    }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = "LINK_INTERFACE_MULTIPLICITY";
    propName += suffix;
    if (const char* config_reps = this->GetProperty(propName)) {
      sscanf(config_reps, "%u", &iface.Multiplicity);
    } else if (const char* reps =
                 this->GetProperty("LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps, "%u", &iface.Multiplicity);
    }
  }
}